

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_test.cpp
# Opt level: O2

void __thiscall testNothing::test_method(testNothing *this)

{
  log_level lVar1;
  unit_test_log_t local_41;
  begin local_40;
  lazy_ostream local_28;
  undefined8 *local_18;
  char *local_10;
  
  local_40.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
  ;
  local_40.m_file_name.m_end = "";
  local_40.m_line_num = 0x6f;
  lVar1 = boost::unit_test::unit_test_log_t::operator<<
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40);
  boost::unit_test::unit_test_log_t::operator()(&local_41,lVar1);
  local_28.m_empty = false;
  local_28._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001157e8;
  local_18 = &boost::unit_test::lazy_ostream::inst;
  local_10 = "This test doesn\'t check anything";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_41,&local_28);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_41);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testNothing)
{
    BOOST_TEST_MESSAGE("This test doesn't check anything");
}